

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

void memory_region_filter_subregions_ppc(MemoryRegion *mr,int32_t level)

{
  MemoryRegion *pMVar1;
  MemoryRegion *subregion;
  
  pMVar1 = (mr->subregions).tqh_first;
  while (subregion = pMVar1, subregion != (MemoryRegion *)0x0) {
    pMVar1 = (subregion->subregions_link).tqe_next;
    if (level <= subregion->priority) {
      memory_region_del_subregion_ppc(mr,subregion);
      (*subregion->destructor)(subregion);
      g_free(subregion);
      mr->uc->memory_region_update_pending = true;
    }
  }
  memory_region_transaction_commit_ppc(mr);
  return;
}

Assistant:

void memory_region_filter_subregions(MemoryRegion *mr, int32_t level)
{
    MemoryRegion *subregion, *subregion_next;
    memory_region_transaction_begin();
    QTAILQ_FOREACH_SAFE(subregion, &mr->subregions, subregions_link, subregion_next) {
        if (subregion->priority >= level) {
            memory_region_del_subregion(mr, subregion);
            subregion->destructor(subregion);
            g_free(subregion);
            mr->uc->memory_region_update_pending = true;
        }
    }
    memory_region_transaction_commit(mr);
}